

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void btSoftBody::PSolve_SContacts(btSoftBody *psb,btScalar param_2,btScalar ti)

{
  btScalar *pbVar1;
  long in_RDI;
  btScalar bVar2;
  btVector3 bVar3;
  btScalar j;
  btScalar dot;
  btVector3 corr;
  btVector3 vr;
  btVector3 q;
  btVector3 p;
  Face *f;
  Node *n;
  btVector3 *nr;
  SContact *c;
  int ni;
  int i;
  undefined4 in_stack_fffffffffffffeb8;
  btScalar in_stack_fffffffffffffebc;
  btScalar in_stack_fffffffffffffec0;
  btScalar in_stack_fffffffffffffec4;
  btVector3 *in_stack_fffffffffffffec8;
  btScalar in_stack_fffffffffffffed0;
  btScalar in_stack_fffffffffffffed4;
  btVector3 local_124;
  float local_114;
  btVector3 local_110;
  float local_100;
  btScalar local_fc;
  btVector3 *in_stack_ffffffffffffff08;
  btScalar in_stack_ffffffffffffff10;
  btScalar in_stack_ffffffffffffff14;
  btVector3 *in_stack_ffffffffffffff18;
  btScalar in_stack_ffffffffffffff20;
  btScalar in_stack_ffffffffffffff24;
  btVector3 local_cc;
  btVector3 local_bc;
  float local_ac;
  btScalar local_a8;
  btScalar local_a4;
  btScalar local_a0;
  btScalar local_9c;
  btVector3 local_98;
  btScalar local_88 [4];
  btScalar local_78 [4];
  btScalar local_68 [4];
  btScalar local_58 [4];
  btScalar local_48 [4];
  Face *local_38;
  Node *local_30;
  btVector3 *local_28;
  SContact *local_20;
  int local_18;
  int local_14;
  long local_8;
  
  local_14 = 0;
  local_8 = in_RDI;
  local_18 = btAlignedObjectArray<btSoftBody::SContact>::size
                       ((btAlignedObjectArray<btSoftBody::SContact> *)(in_RDI + 0x430));
  for (; local_14 < local_18; local_14 = local_14 + 1) {
    local_20 = btAlignedObjectArray<btSoftBody::SContact>::operator[]
                         ((btAlignedObjectArray<btSoftBody::SContact> *)(local_8 + 0x430),local_14);
    local_28 = &local_20->m_normal;
    local_30 = local_20->m_node;
    local_38 = local_20->m_face;
    local_48 = (btScalar  [4])
               BaryEval<btVector3>((btVector3 *)
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff18,
                                   (btVector3 *)
                                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                   in_stack_ffffffffffffff08);
    local_58 = (btScalar  [4])
               BaryEval<btVector3>((btVector3 *)
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff18,
                                   (btVector3 *)
                                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                   in_stack_ffffffffffffff08);
    local_78 = (btScalar  [4])
               operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
    local_88 = (btScalar  [4])
               operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
    local_68 = (btScalar  [4])
               operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
    local_9c = 0.0;
    local_a0 = 0.0;
    local_a4 = 0.0;
    btVector3::btVector3(&local_98,&local_9c,&local_a0,&local_a4);
    local_a8 = btDot((btVector3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (local_a8 < 0.0) {
      in_stack_fffffffffffffed4 = local_20->m_margin;
      in_stack_fffffffffffffed0 =
           btDot((btVector3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      bVar2 = btDot((btVector3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_ac = in_stack_fffffffffffffed4 - (in_stack_fffffffffffffed0 - bVar2);
      local_bc = ::operator*((btVector3 *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffec8->m_floats);
      btVector3::operator+=(&local_98,&local_bc);
    }
    bVar3 = ProjectOnPlane((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8);
    in_stack_ffffffffffffff24 = bVar3.m_floats[0];
    local_cc = ::operator*((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8->m_floats);
    in_stack_fffffffffffffec8 = &local_98;
    btVector3::operator-=(in_stack_fffffffffffffec8,&local_cc);
    bVar3 = ::operator*((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffec8->m_floats);
    in_stack_ffffffffffffff14 = bVar3.m_floats[0];
    in_stack_ffffffffffffff18 = bVar3.m_floats._4_8_;
    in_stack_ffffffffffffff20 = bVar3.m_floats[3];
    btVector3::operator+=(&local_30->m_x,(btVector3 *)&stack0xffffffffffffff14);
    in_stack_fffffffffffffebc = local_20->m_cfm[1];
    pbVar1 = btVector3::x(&local_20->m_weights);
    local_100 = in_stack_fffffffffffffebc * *pbVar1;
    bVar3 = ::operator*((btVector3 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffec8->m_floats);
    local_fc = bVar3.m_floats[0];
    in_stack_ffffffffffffff08 = bVar3.m_floats._4_8_;
    in_stack_ffffffffffffff10 = bVar3.m_floats[3];
    btVector3::operator-=(&local_38->m_n[0]->m_x,(btVector3 *)&local_fc);
    in_stack_fffffffffffffec0 = local_20->m_cfm[1];
    pbVar1 = btVector3::y(&local_20->m_weights);
    local_114 = in_stack_fffffffffffffec0 * *pbVar1;
    local_110 = ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffec8->m_floats);
    btVector3::operator-=(&local_38->m_n[1]->m_x,&local_110);
    in_stack_fffffffffffffec4 = local_20->m_cfm[1];
    btVector3::z(&local_20->m_weights);
    local_124 = ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffec8->m_floats);
    btVector3::operator-=(&local_38->m_n[2]->m_x,&local_124);
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_SContacts(btSoftBody* psb,btScalar,btScalar ti)
{
	for(int i=0,ni=psb->m_scontacts.size();i<ni;++i)
	{
		const SContact&		c=psb->m_scontacts[i];
		const btVector3&	nr=c.m_normal;
		Node&				n=*c.m_node;
		Face&				f=*c.m_face;
		const btVector3		p=BaryEval(	f.m_n[0]->m_x,
			f.m_n[1]->m_x,
			f.m_n[2]->m_x,
			c.m_weights);
		const btVector3		q=BaryEval(	f.m_n[0]->m_q,
			f.m_n[1]->m_q,
			f.m_n[2]->m_q,
			c.m_weights);											
		const btVector3		vr=(n.m_x-n.m_q)-(p-q);
		btVector3			corr(0,0,0);
		btScalar dot = btDot(vr,nr);
		if(dot<0)
		{
			const btScalar	j=c.m_margin-(btDot(nr,n.m_x)-btDot(nr,p));
			corr+=c.m_normal*j;
		}
		corr			-=	ProjectOnPlane(vr,nr)*c.m_friction;
		n.m_x			+=	corr*c.m_cfm[0];
		f.m_n[0]->m_x	-=	corr*(c.m_cfm[1]*c.m_weights.x());
		f.m_n[1]->m_x	-=	corr*(c.m_cfm[1]*c.m_weights.y());
		f.m_n[2]->m_x	-=	corr*(c.m_cfm[1]*c.m_weights.z());
	}
}